

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frobtadsapp.cc
# Opt level: O2

void winResizeHandler(int param_1)

{
  (*globalApp->_vptr_FrobTadsApplication[1])();
  G_oss_screen_width = (*globalApp->_vptr_FrobTadsApplication[0xb])();
  G_oss_screen_height = (*globalApp->_vptr_FrobTadsApplication[10])();
  osssb_on_resize_screen();
  (*globalApp->_vptr_FrobTadsApplication[4])();
  signal(0x1c,winResizeHandler);
  return;
}

Assistant:

void
winResizeHandler( int )
{
    // Re-initialize the screen.
    globalApp->resizeEvent();

    // Change the corresponding global variables that TADS uses to
    // tell the size.
    G_oss_screen_width = globalApp->width();
    G_oss_screen_height = globalApp->height();

    // Tell TADS that the size just changed.
    osssb_on_resize_screen();
    // Flush the screen just in case.
    globalApp->flush();

    // Restore the timeout.
    // FIXME: This resets the timeout to its initial
    // value.  We want to actually set it to the
    // remaining timeout.
    //globalApp->fGameWindow->setTimeout(0);

    // Not sure why, but on some systems the handler has to be
    // installed over and over again after the signal is handled.
#if HAVE_SIGWINCH
    signal(SIGWINCH, winResizeHandler);
#endif
}